

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O2

void __thiscall nuraft::snapshot_io_mgr::snapshot_io_mgr(snapshot_io_mgr *this)

{
  EventAwaiter *this_00;
  thread tStack_38;
  snapshot_io_mgr *local_30;
  code *local_28;
  undefined8 local_20;
  
  (this->io_thread_)._M_id._M_thread = 0;
  this_00 = (EventAwaiter *)operator_new(0x60);
  EventAwaiter::EventAwaiter(this_00);
  std::__shared_ptr<nuraft::EventAwaiter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::EventAwaiter,void>
            ((__shared_ptr<nuraft::EventAwaiter,(__gnu_cxx::_Lock_policy)2> *)&this->io_thread_ea_,
             this_00);
  (this->terminating_)._M_base._M_i = false;
  (this->queue_).
  super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->queue_;
  (this->queue_).
  super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->queue_;
  (this->queue_).
  super__List_base<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>,_std::allocator<std::shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->queue_lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queue_lock_).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->queue_lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queue_lock_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queue_lock_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_28 = async_io_loop;
  local_20 = 0;
  local_30 = this;
  std::thread::thread<void(nuraft::snapshot_io_mgr::*)(),nuraft::snapshot_io_mgr*,void>
            (&tStack_38,(type *)&local_28,&local_30);
  std::thread::operator=(&this->io_thread_,&tStack_38);
  std::thread::~thread(&tStack_38);
  return;
}

Assistant:

snapshot_io_mgr::snapshot_io_mgr()
    : io_thread_ea_(new EventAwaiter())
    , terminating_(false)
{
    io_thread_ = std::thread(&snapshot_io_mgr::async_io_loop, this);
}